

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_remove_bulk(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  uint64_t uVar2;
  roaring64_bulk_context_t local_38;
  
  r = roaring64_bitmap_create();
  local_38.high_bytes[0] = '\0';
  local_38.high_bytes[1] = '\0';
  local_38.high_bytes[2] = '\0';
  local_38.high_bytes[3] = '\0';
  local_38.high_bytes[4] = '\0';
  local_38.high_bytes[5] = '\0';
  local_38._6_2_ = 0;
  local_38.leaf = (roaring64_leaf_t *)0x0;
  for (uVar2 = 0; uVar2 != 10000000; uVar2 = uVar2 + 1000) {
    roaring64_bitmap_add_bulk(r,&local_38,uVar2);
  }
  local_38.high_bytes[0] = '\0';
  local_38.high_bytes[1] = '\0';
  local_38.high_bytes[2] = '\0';
  local_38.high_bytes[3] = '\0';
  local_38.high_bytes[4] = '\0';
  local_38.high_bytes[5] = '\0';
  local_38._6_2_ = 0;
  local_38.leaf = (roaring64_leaf_t *)0x0;
  for (uVar2 = 1000; uVar2 != 0x989298; uVar2 = uVar2 + 1000) {
    roaring64_bitmap_remove_bulk(r,&local_38,uVar2);
    assert_r64_valid((roaring64_bitmap_t *)r);
  }
  local_38.high_bytes[0] = '\0';
  local_38.high_bytes[1] = '\0';
  local_38.high_bytes[2] = '\0';
  local_38.high_bytes[3] = '\0';
  local_38.high_bytes[4] = '\0';
  local_38.high_bytes[5] = '\0';
  local_38._6_2_ = 0;
  local_38.leaf = (roaring64_leaf_t *)0x0;
  _Var1 = roaring64_bitmap_contains_bulk(r,&local_38,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_bulk(r, &context, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x274);
  for (uVar2 = 1000; uVar2 != 0x989298; uVar2 = uVar2 + 1000) {
    _Var1 = roaring64_bitmap_contains_bulk(r,&local_38,uVar2);
    _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_bulk(r, &context, i * 1000)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x276);
  }
  _Var1 = roaring64_bitmap_contains_bulk(r,&local_38,0x989298);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_bulk(r, &context, 9999000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x278);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_remove_bulk) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 10000; ++i) {
        roaring64_bitmap_add_bulk(r, &context, i * 1000);
    }
    context = {};
    for (uint64_t i = 1; i < 9999; ++i) {
        roaring64_bitmap_remove_bulk(r, &context, i * 1000);
        assert_r64_valid(r);
    }
    context = {};
    assert_true(roaring64_bitmap_contains_bulk(r, &context, 0));
    for (uint64_t i = 1; i < 9999; ++i) {
        assert_false(roaring64_bitmap_contains_bulk(r, &context, i * 1000));
    }
    assert_true(roaring64_bitmap_contains_bulk(r, &context, 9999000));
    roaring64_bitmap_free(r);
}